

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

bool __thiscall Debugger::InstallDebugCallbacks(Debugger *this,JsValueRef hostDebugObject)

{
  bool bVar1;
  int local_1c;
  HRESULT hr;
  JsValueRef hostDebugObject_local;
  Debugger *this_local;
  
  local_1c = 0;
  bVar1 = WScriptJsrt::InstallObjectsOnObject(hostDebugObject,"JsDiagGetSource",GetSource);
  if (bVar1) {
    bVar1 = WScriptJsrt::InstallObjectsOnObject(hostDebugObject,"JsDiagSetBreakpoint",SetBreakpoint)
    ;
    if (bVar1) {
      bVar1 = WScriptJsrt::InstallObjectsOnObject
                        (hostDebugObject,"JsDiagGetStackTrace",GetStackTrace);
      if (bVar1) {
        bVar1 = WScriptJsrt::InstallObjectsOnObject
                          (hostDebugObject,"JsDiagGetBreakpoints",GetBreakpoints);
        if (bVar1) {
          bVar1 = WScriptJsrt::InstallObjectsOnObject
                            (hostDebugObject,"JsDiagRemoveBreakpoint",RemoveBreakpoint);
          if (bVar1) {
            bVar1 = WScriptJsrt::InstallObjectsOnObject
                              (hostDebugObject,"JsDiagSetBreakOnException",SetBreakOnException);
            if (bVar1) {
              bVar1 = WScriptJsrt::InstallObjectsOnObject
                                (hostDebugObject,"JsDiagGetBreakOnException",GetBreakOnException);
              if (bVar1) {
                bVar1 = WScriptJsrt::InstallObjectsOnObject
                                  (hostDebugObject,"JsDiagSetStepType",SetStepType);
                if (bVar1) {
                  bVar1 = WScriptJsrt::InstallObjectsOnObject
                                    (hostDebugObject,"JsDiagGetScripts",GetScripts);
                  if (bVar1) {
                    bVar1 = WScriptJsrt::InstallObjectsOnObject
                                      (hostDebugObject,"JsDiagGetStackProperties",GetStackProperties
                                      );
                    if (bVar1) {
                      bVar1 = WScriptJsrt::InstallObjectsOnObject
                                        (hostDebugObject,"JsDiagGetProperties",GetProperties);
                      if (bVar1) {
                        bVar1 = WScriptJsrt::InstallObjectsOnObject
                                          (hostDebugObject,"JsDiagGetObjectFromHandle",
                                           GetObjectFromHandle);
                        if (bVar1) {
                          bVar1 = WScriptJsrt::InstallObjectsOnObject
                                            (hostDebugObject,"JsDiagEvaluate",Evaluate);
                          if (!bVar1) {
                            local_1c = -0x7fffbffb;
                          }
                        }
                        else {
                          local_1c = -0x7fffbffb;
                        }
                      }
                      else {
                        local_1c = -0x7fffbffb;
                      }
                    }
                    else {
                      local_1c = -0x7fffbffb;
                    }
                  }
                  else {
                    local_1c = -0x7fffbffb;
                  }
                }
                else {
                  local_1c = -0x7fffbffb;
                }
              }
              else {
                local_1c = -0x7fffbffb;
              }
            }
            else {
              local_1c = -0x7fffbffb;
            }
          }
          else {
            local_1c = -0x7fffbffb;
          }
        }
        else {
          local_1c = -0x7fffbffb;
        }
      }
      else {
        local_1c = -0x7fffbffb;
      }
    }
    else {
      local_1c = -0x7fffbffb;
    }
  }
  else {
    local_1c = -0x7fffbffb;
  }
  return local_1c != 0;
}

Assistant:

bool Debugger::InstallDebugCallbacks(JsValueRef hostDebugObject)
{
    HRESULT hr = S_OK;
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetSource", Debugger::GetSource));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagSetBreakpoint", Debugger::SetBreakpoint));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetStackTrace", Debugger::GetStackTrace));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetBreakpoints", Debugger::GetBreakpoints));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagRemoveBreakpoint", Debugger::RemoveBreakpoint));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagSetBreakOnException", Debugger::SetBreakOnException));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetBreakOnException", Debugger::GetBreakOnException));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagSetStepType", Debugger::SetStepType));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetScripts", Debugger::GetScripts));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetStackProperties", Debugger::GetStackProperties));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetProperties", Debugger::GetProperties));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetObjectFromHandle", Debugger::GetObjectFromHandle));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagEvaluate", Debugger::Evaluate));
Error:
    return hr != S_OK;
}